

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O0

Am_Wrapper * __thiscall Am_Gesture_Trainer_Data::Make_Unique(Am_Gesture_Trainer_Data *this)

{
  bool bVar1;
  Am_Gesture_Trainer_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    Am_Gesture_Trainer_Data(this_local,this);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data()
{
  head = tail = nullptr;
  nclasses = 0;
  cached_classifier = nullptr;
}